

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

MPI_Datatype armci_type_to_mpi_type(int type)

{
  int in_EDI;
  MPI_Datatype mpi_dt;
  int in_stack_ffffffffffffffec;
  MPI_Datatype in_stack_fffffffffffffff0;
  
  if (in_EDI == -99) {
    in_stack_fffffffffffffff0 = (MPI_Datatype)&ompi_mpi_int;
  }
  else if (in_EDI == -0x65) {
    in_stack_fffffffffffffff0 = (MPI_Datatype)&ompi_mpi_long;
  }
  else if (in_EDI == -0x66) {
    in_stack_fffffffffffffff0 = (MPI_Datatype)&ompi_mpi_long_long_int;
  }
  else if (in_EDI == -0x132) {
    in_stack_fffffffffffffff0 = (MPI_Datatype)&ompi_mpi_float;
  }
  else if (in_EDI == -0x133) {
    in_stack_fffffffffffffff0 = (MPI_Datatype)&ompi_mpi_double;
  }
  else {
    comex_error((char *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  }
  return in_stack_fffffffffffffff0;
}

Assistant:

static MPI_Datatype armci_type_to_mpi_type(int type)
{
    MPI_Datatype mpi_dt;

    if (type == ARMCI_INT) {
        mpi_dt = MPI_INT;
    }
    else if (type == ARMCI_LONG) {
        mpi_dt = MPI_LONG;
    }
    else if (type == ARMCI_LONG_LONG) {
        mpi_dt = MPI_LONG_LONG;
    }
    else if (type == ARMCI_FLOAT) {
        mpi_dt = MPI_FLOAT;
    }
    else if (type == ARMCI_DOUBLE) {
        mpi_dt = MPI_DOUBLE;
    }
    else {
        comex_error("armci_type_to_mpi_type: unrecognized type", type);
    }

    return mpi_dt;
}